

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c++
# Opt level: O1

Maybe<long_long> __thiscall
kj::anon_unknown_55::tryParseSigned(anon_unknown_55 *this,StringPtr *s,longlong min,longlong max)

{
  char *__nptr;
  char *in_RAX;
  int *piVar1;
  longlong lVar2;
  int __base;
  anon_union_8_1_a8c68091_for_NullableValue<long_long>_2 aVar3;
  Maybe<long_long> MVar4;
  char *endPtr;
  char *local_38;
  
  aVar3.value = min;
  if (1 < (s->content).size_) {
    local_38 = in_RAX;
    piVar1 = __errno_location();
    *piVar1 = 0;
    __nptr = (s->content).ptr;
    __base = 10;
    if (__nptr[*__nptr == '-'] == '0') {
      __base = 10;
      if ((__nptr[(ulong)(*__nptr == '-') + 1] & 0xdfU) == 0x58) {
        __base = 0x10;
      }
    }
    lVar2 = strtoll(__nptr,&local_38,__base);
    aVar3 = (anon_union_8_1_a8c68091_for_NullableValue<long_long>_2)(s->content).size_;
    if (((local_38 == (s->content).ptr + (aVar3.value - 1)) && (*piVar1 != 0x22)) &&
       (aVar3._1_7_ = (undefined7)((ulong)aVar3 >> 8), aVar3.value._0_1_ = lVar2 <= max,
       min <= lVar2 && lVar2 <= max)) {
      *this = (anon_unknown_55)0x1;
      *(longlong *)(this + 8) = lVar2;
      goto LAB_001e5cfa;
    }
  }
  *this = (anon_unknown_55)0x0;
LAB_001e5cfa:
  MVar4.ptr.field_1.value = aVar3.value;
  MVar4.ptr._0_8_ = this;
  return (Maybe<long_long>)MVar4.ptr;
}

Assistant:

Maybe<long long> tryParseSigned(const StringPtr& s, long long min, long long max) {
  if (s == nullptr) { return kj::none; } // String does not contain valid number.
  char *endPtr;
  errno = 0;
  auto value = strtoll(s.begin(), &endPtr, isHex(s.cStr()) ? 16 : 10);
  if (endPtr != s.end() || errno == ERANGE || value < min || max < value) {
    return kj::none;
  }
  return value;
}